

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_c3bcac::HandleStripCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  size_t name;
  cmExecutionStatus *this;
  bool bVar1;
  size_type sVar2;
  cmMakefile *this_00;
  string local_c8 [32];
  string_view local_a8;
  char *local_98;
  size_t outLength;
  size_t cc;
  char *ptr;
  size_t endPos;
  size_t startPos;
  size_t inStringLength;
  string *variableName;
  string *stringValue;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_20;
  if (sVar2 == 3) {
    variableName = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,1);
    inStringLength =
         (size_t)std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,2);
    startPos = std::__cxx11::string::size();
    endPos = startPos + 1;
    ptr = (char *)0x0;
    cc = std::__cxx11::string::c_str();
    for (outLength = 0; outLength < startPos; outLength = outLength + 1) {
      bVar1 = cmIsSpace(*(char *)cc);
      if (!bVar1) {
        if (startPos < endPos) {
          endPos = outLength;
        }
        ptr = (char *)outLength;
      }
      cc = cc + 1;
    }
    if (startPos < endPos) {
      local_98 = (char *)0x0;
      endPos = 0;
    }
    else {
      local_98 = ptr + (1 - endPos);
    }
    this_00 = cmExecutionStatus::GetMakefile(local_20);
    name = inStringLength;
    std::__cxx11::string::substr((ulong)local_c8,(ulong)variableName);
    local_a8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_c8);
    cmMakefile::AddDefinition(this_00,(string *)name,local_a8);
    std::__cxx11::string::~string(local_c8);
    args_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command STRIP requires two arguments.",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = false;
  }
  return args_local._7_1_;
}

Assistant:

bool HandleStripCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError("sub-command STRIP requires two arguments.");
    return false;
  }

  const std::string& stringValue = args[1];
  const std::string& variableName = args[2];
  size_t inStringLength = stringValue.size();
  size_t startPos = inStringLength + 1;
  size_t endPos = 0;
  const char* ptr = stringValue.c_str();
  size_t cc;
  for (cc = 0; cc < inStringLength; ++cc) {
    if (!cmIsSpace(*ptr)) {
      if (startPos > inStringLength) {
        startPos = cc;
      }
      endPos = cc;
    }
    ++ptr;
  }

  size_t outLength = 0;

  // if the input string didn't contain any non-space characters, return
  // an empty string
  if (startPos > inStringLength) {
    outLength = 0;
    startPos = 0;
  } else {
    outLength = endPos - startPos + 1;
  }

  status.GetMakefile().AddDefinition(variableName,
                                     stringValue.substr(startPos, outLength));
  return true;
}